

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void QPDF::decryptStream(shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
                        QPDF *qpdf_for_warning,Pipeline **pipeline,QPDFObjGen og,
                        QPDFObjectHandle *stream_dict,bool is_root_metadata,
                        unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *decrypt_pipeline)

{
  string *key;
  element_type *peVar1;
  Pipeline *pPVar2;
  shared_ptr<InputSource> *psVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  encryption_method_e eVar7;
  undefined4 extraout_var;
  qpdf_offset_t offset;
  long *plVar8;
  uchar *puVar9;
  Pl_AES_PDF *this;
  Pl_RC4 *this_00;
  element_type *peVar10;
  QPDFObjGen og_00;
  byte bVar11;
  undefined1 use_aes;
  byte bVar12;
  pointer __p;
  pointer __p_1;
  string method_source;
  QPDFObjectHandle decode_parms;
  QPDFObjectHandle decode;
  QPDFObjectHandle filter;
  QPDFObjectHandle crypt_params;
  string type;
  undefined1 local_238 [128];
  shared_ptr<QPDF::EncryptionParameters> *local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  string local_170;
  encryption_method_e local_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  QPDF local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  shared_ptr<QPDF::EncryptionParameters> local_d0;
  shared_ptr<QPDF::EncryptionParameters> local_c0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  QPDF *local_88;
  shared_ptr<InputSource> *local_80;
  QPDFObjGen local_78;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = 0;
  local_238._0_8_ = local_238 + 0x10;
  local_1b8 = encp;
  local_80 = file;
  local_78 = og;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Type","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_190,(string *)stream_dict);
  bVar4 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_190);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
  }
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if (bVar4) {
    local_190._0_8_ = (element_type *)local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"/Type","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b0,(string *)stream_dict);
    QPDFObjectHandle::getName_abi_cxx11_((string *)local_238,(QPDFObjectHandle *)local_1b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
    }
    if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
      operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_b0);
  use_aes = (undefined1)og.obj;
  if (iVar5 == 0) goto LAB_0020b555;
  if (((local_1b8->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->encryption_V < 4) {
    bVar11 = 0;
  }
  else {
    local_190._0_8_ = local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"/StmF from /Encrypt dictionary","");
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Filter","");
    local_88 = qpdf_for_warning;
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_180 + 0x10),(string *)stream_dict);
    local_1b0._0_8_ = (element_type *)local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Crypt","");
    bVar4 = QPDFObjectHandle::isOrHasName
                      ((QPDFObjectHandle *)(local_180 + 0x10),(string *)local_1b0);
    if ((element_type *)local_1b0._0_8_ != (element_type *)local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length);
    }
    local_118._16_8_ = pipeline;
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    use_aes = (undefined1)og.obj;
    eVar7 = e_unknown;
    if (bVar4) {
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/DecodeParms","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b0,(string *)stream_dict);
      bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_);
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      use_aes = (undefined1)og.obj;
      local_238._0_8_ = local_238 + 0x10;
      if (bVar4) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_180 + 0x10),(string *)stream_dict);
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        local_238._0_8_ = local_238 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"/CryptFilterDecodeParms","");
        local_1b0._0_8_ = (element_type *)local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
        bVar4 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)(local_180 + 0x10),(string *)local_238,
                           (string *)local_1b0);
        if ((element_type *)local_1b0._0_8_ != (element_type *)local_1a0) {
          operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
        }
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        eVar7 = e_unknown;
        local_128._8_8_ = local_170._M_string_length;
        if (bVar4) {
          local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (local_1b8->
                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_1b8->
               super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_238._0_8_ = local_238 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Name","");
          QPDFObjectHandle::getKey(&local_60,(string *)(local_180 + 0x10));
          eVar7 = interpretCF(&local_c0,&local_60);
          if (local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
            operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
          }
          if (local_c0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.
                       super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          use_aes = 0x20;
          std::__cxx11::string::_M_replace((ulong)local_190,0,(char *)local_190._8_8_,0x27f462);
          local_128._8_8_ = local_170._M_string_length;
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_180 + 0x10),(string *)stream_dict);
        bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_180 + 0x10));
        if (bVar4) {
          local_1b0._0_8_ = (element_type *)local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/Filter","");
          QPDFObjectHandle::getKey(&local_70,(string *)stream_dict);
          bVar4 = QPDFObjectHandle::isArray(&local_70);
          if (local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((element_type *)local_1b0._0_8_ != (element_type *)local_1a0) {
            operator_delete((void *)local_1b0._0_8_,local_1a0._0_8_ + 1);
          }
        }
        else {
          bVar4 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length);
        }
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        use_aes = (undefined1)og.obj;
        if (bVar4 == false) goto LAB_0020b1da;
        local_238._0_8_ = local_238 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Filter","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_128,(string *)stream_dict);
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        local_238._0_8_ = local_238 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/DecodeParms","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_148,(string *)stream_dict);
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_128);
        iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_148);
        use_aes = (undefined1)og.obj;
        eVar7 = e_unknown;
        if (iVar5 == iVar6) {
          local_90 = &local_170.field_2;
          iVar5 = 0;
          key = (string *)(local_118 + 0x18);
          while( true ) {
            iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_128);
            use_aes = (undefined1)og.obj;
            if (iVar6 <= iVar5) break;
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)key,(int)local_128);
            local_238._0_8_ = local_238 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Crypt","");
            bVar4 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)key,(string *)local_238);
            if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
              operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._32_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._32_8_);
            }
            if (bVar4) {
              QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)key,(int)local_148);
              bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)key);
              local_14c = eVar7;
              if (bVar4) {
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_180 + 0x10),"/Name","");
                QPDFObjectHandle::getKey(&local_40,key);
                bVar4 = QPDFObjectHandle::isName(&local_40);
                if (local_40.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_40.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  local_170.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                bVar4 = false;
              }
              eVar7 = local_14c;
              if (bVar4 != false) {
                local_d0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (local_1b8->
                         super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                local_d0.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_1b8->
                     super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if ((QPDFObjGen)
                    local_d0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (QPDFObjGen)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)
                     ((long)local_d0.
                            super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 8) =
                         *(_Atomic_word *)
                          ((long)local_d0.
                                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)
                     ((long)local_d0.
                            super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 8) =
                         *(_Atomic_word *)
                          ((long)local_d0.
                                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 8) + 1;
                  }
                }
                local_238._0_8_ = local_238 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"/Name","");
                QPDFObjectHandle::getKey(&local_50,key);
                eVar7 = interpretCF(&local_d0,&local_50);
                if (local_50.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_50.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                  operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                }
                if ((QPDFObjGen)
                    local_d0.
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (QPDFObjGen)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_d0.
                             super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                og.obj = 0x28;
                og.gen = 0;
                std::__cxx11::string::_M_replace
                          ((ulong)local_190,0,(char *)local_190._8_8_,0x27f483);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._32_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._32_8_);
              }
            }
            iVar5 = iVar5 + 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
    }
LAB_0020b1da:
    psVar3 = local_80;
    if ((eVar7 == e_unknown) &&
       ((peVar1 = (local_1b8->
                  super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        , !is_root_metadata || (eVar7 = e_none, peVar1->encrypt_metadata != false)))) {
      eVar7 = peVar1->cf_stream;
    }
    if ((eVar7 < (e_aesv3|e_unknown)) && ((0x1dU >> (eVar7 & 0x1f) & 1) != 0)) {
      bVar12 = 0x1c >> ((byte)eVar7 & 0x1f);
      bVar11 = 0x18 >> ((byte)eVar7 & 0x1f);
      pipeline = (Pipeline **)local_118._16_8_;
    }
    else {
      iVar5 = (*((local_80->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                _vptr_InputSource[3])();
      local_128._0_8_ = (element_type *)local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
      pipeline = (Pipeline **)local_118._16_8_;
      offset = InputSource::getLastOffset
                         ((psVar3->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_118 + 0x18),"unknown encryption filter for streams (check ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
      ;
      plVar8 = (long *)std::__cxx11::string::append(local_118 + 0x18);
      peVar10 = (element_type *)(plVar8 + 2);
      if ((element_type *)*plVar8 == peVar10) {
        local_138._0_8_ =
             *(undefined8 *)
              &(((_Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                  *)&peVar10->value)->
               super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               ).
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               ._M_u;
        local_138._8_8_ = *(QPDFObjGen *)(plVar8 + 3);
        local_148._0_8_ = (element_type *)local_138;
      }
      else {
        local_138._0_8_ =
             *(undefined8 *)
              &(((_Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                  *)&peVar10->value)->
               super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               ).
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               .
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
               ._M_u;
        local_148._0_8_ = (element_type *)*plVar8;
      }
      local_148._8_8_ = plVar8[1];
      *plVar8 = (long)peVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      QPDFExc::QPDFExc((QPDFExc *)local_238,qpdf_e_damaged_pdf,
                       (string *)CONCAT44(extraout_var,iVar5),(string *)local_128,offset,
                       (string *)local_148);
      use_aes = (undefined1)offset;
      warn(local_88,(QPDFExc *)local_238);
      QPDFExc::~QPDFExc((QPDFExc *)local_238);
      if ((element_type *)local_148._0_8_ != (element_type *)local_138) {
        operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._24_8_ != &local_f0) {
        operator_delete((void *)local_118._24_8_,local_f0._M_allocated_capacity + 1);
      }
      if ((element_type *)local_128._0_8_ != (element_type *)local_118) {
        operator_delete((void *)local_128._0_8_,local_118._0_8_ + 1);
      }
      ((local_1b8->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->cf_stream = e_aes;
      bVar12 = 1;
      bVar11 = 1;
    }
    if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
      operator_delete((void *)local_190._0_8_,local_180._0_8_ + 1);
    }
    if ((bVar12 & 1) == 0) goto LAB_0020b555;
  }
  local_e0.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>)
       (local_1b8->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_d8._M_pi =
       (local_1b8->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
    }
  }
  og_00.obj = bVar11 & 1;
  og_00.gen = 0;
  getKeyForObject_abi_cxx11_
            ((string *)local_238,&local_e0,(shared_ptr<QPDF::EncryptionParameters> *)local_78,og_00,
             (bool)use_aes);
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if ((bVar11 & 1) == 0) {
    puVar9 = QUtil::unsigned_char_pointer((string *)local_238);
    if ((local_238._8_8_ & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_238._8_8_);
    }
    this_00 = (Pl_RC4 *)operator_new(0x58);
    Pl_RC4::Pl_RC4(this_00,"RC4 stream decryption",*pipeline,puVar9,(int)local_238._8_8_,0x10000);
    local_190._0_8_ = (element_type *)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)this_00;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_>::~unique_ptr
              ((unique_ptr<Pl_RC4,_std::default_delete<Pl_RC4>_> *)local_190);
  }
  else {
    puVar9 = QUtil::unsigned_char_pointer((string *)local_238);
    this = (Pl_AES_PDF *)operator_new(0xa8);
    Pl_AES_PDF::Pl_AES_PDF(this,"AES stream decryption",*pipeline,false,puVar9,local_238._8_8_);
    local_190._0_8_ = (element_type *)0x0;
    pPVar2 = (decrypt_pipeline->_M_t).
             super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
    (decrypt_pipeline->_M_t).super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl = (Pipeline *)this;
    if (pPVar2 != (Pipeline *)0x0) {
      (*pPVar2->_vptr_Pipeline[1])();
    }
    std::unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_>::~unique_ptr
              ((unique_ptr<Pl_AES_PDF,_std::default_delete<Pl_AES_PDF>_> *)local_190);
  }
  *pipeline = (decrypt_pipeline->_M_t).
              super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
              super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
              super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl;
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
LAB_0020b555:
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void
QPDF::decryptStream(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    Pipeline*& pipeline,
    QPDFObjGen og,
    QPDFObjectHandle& stream_dict,
    bool is_root_metadata,
    std::unique_ptr<Pipeline>& decrypt_pipeline)
{
    std::string type;
    if (stream_dict.getKey("/Type").isName()) {
        type = stream_dict.getKey("/Type").getName();
    }
    if (type == "/XRef") {
        QTC::TC("qpdf", "QPDF_encryption xref stream from encrypted file");
        return;
    }
    bool use_aes = false;
    if (encp->encryption_V >= 4) {
        encryption_method_e method = e_unknown;
        std::string method_source = "/StmF from /Encrypt dictionary";

        if (stream_dict.getKey("/Filter").isOrHasName("/Crypt")) {
            if (stream_dict.getKey("/DecodeParms").isDictionary()) {
                QPDFObjectHandle decode_parms = stream_dict.getKey("/DecodeParms");
                if (decode_parms.isDictionaryOfType("/CryptFilterDecodeParms")) {
                    QTC::TC("qpdf", "QPDF_encryption stream crypt filter");
                    method = interpretCF(encp, decode_parms.getKey("/Name"));
                    method_source = "stream's Crypt decode parameters";
                }
            } else if (
                stream_dict.getKey("/DecodeParms").isArray() &&
                stream_dict.getKey("/Filter").isArray()) {
                QPDFObjectHandle filter = stream_dict.getKey("/Filter");
                QPDFObjectHandle decode = stream_dict.getKey("/DecodeParms");
                if (filter.getArrayNItems() == decode.getArrayNItems()) {
                    for (int i = 0; i < filter.getArrayNItems(); ++i) {
                        if (filter.getArrayItem(i).isNameAndEquals("/Crypt")) {
                            QPDFObjectHandle crypt_params = decode.getArrayItem(i);
                            if (crypt_params.isDictionary() &&
                                crypt_params.getKey("/Name").isName()) {
                                QTC::TC("qpdf", "QPDF_encrypt crypt array");
                                method = interpretCF(encp, crypt_params.getKey("/Name"));
                                method_source = "stream's Crypt decode parameters (array)";
                            }
                        }
                    }
                }
            }
        }

        if (method == e_unknown) {
            if ((!encp->encrypt_metadata) && is_root_metadata) {
                QTC::TC("qpdf", "QPDF_encryption cleartext metadata");
                method = e_none;
            } else {
                method = encp->cf_stream;
            }
        }
        use_aes = false;
        switch (method) {
        case e_none:
            return;
            break;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            // filter local to this stream.
            qpdf_for_warning.warn(QPDFExc(
                qpdf_e_damaged_pdf,
                file->getName(),
                "",
                file->getLastOffset(),
                "unknown encryption filter for streams (check " + method_source +
                    "); streams may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_stream.  Assume we'd want to use AES if V == 4.
            encp->cf_stream = e_aes;
            use_aes = true;
            break;
        }
    }
    std::string key = getKeyForObject(encp, og, use_aes);
    if (use_aes) {
        QTC::TC("qpdf", "QPDF_encryption aes decode stream");
        decrypt_pipeline = std::make_unique<Pl_AES_PDF>(
            "AES stream decryption",
            pipeline,
            false,
            QUtil::unsigned_char_pointer(key),
            key.length());
    } else {
        QTC::TC("qpdf", "QPDF_encryption rc4 decode stream");
        decrypt_pipeline = std::make_unique<Pl_RC4>(
            "RC4 stream decryption",
            pipeline,
            QUtil::unsigned_char_pointer(key),
            toI(key.length()));
    }
    pipeline = decrypt_pipeline.get();
}